

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraverser.h
# Opt level: O0

void __thiscall glslang::TLiveTraverser::pushFunction(TLiveTraverser *this,TString *name)

{
  bool bVar1;
  int iVar2;
  TOperator TVar3;
  TIntermNode *pTVar4;
  undefined4 extraout_var;
  ulong uVar5;
  size_type sVar6;
  reference ppTVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  value_type local_30;
  TIntermAggregate *candidate;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvStack_20;
  uint f;
  TIntermSequence *globals;
  TString *name_local;
  TLiveTraverser *this_local;
  
  globals = (TIntermSequence *)name;
  name_local = (TString *)this;
  pTVar4 = TIntermediate::getTreeRoot(this->intermediate);
  iVar2 = (*pTVar4->_vptr_TIntermNode[6])();
  pvStack_20 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 400))();
  candidate._4_4_ = 0;
  do {
    uVar5 = (ulong)candidate._4_4_;
    sVar6 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvStack_20);
    if (sVar6 <= uVar5) {
      return;
    }
    ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (pvStack_20,(ulong)candidate._4_4_);
    iVar2 = (*(*ppTVar7)->_vptr_TIntermNode[6])();
    local_30 = (value_type)CONCAT44(extraout_var_00,iVar2);
    if ((local_30 != (value_type)0x0) &&
       (TVar3 = TIntermOperator::getOp((TIntermOperator *)local_30), TVar3 == EOpFunction)) {
      iVar2 = (*(local_30->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x35])();
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_01,iVar2),
                              (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)globals);
      if (bVar1) {
        std::__cxx11::
        list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>::push_back
                  (&this->destinations,&local_30);
        return;
      }
    }
    candidate._4_4_ = candidate._4_4_ + 1;
  } while( true );
}

Assistant:

void pushFunction(const TString& name)
    {
        TIntermSequence& globals = intermediate.getTreeRoot()->getAsAggregate()->getSequence();
        for (unsigned int f = 0; f < globals.size(); ++f) {
            TIntermAggregate* candidate = globals[f]->getAsAggregate();
            if (candidate && candidate->getOp() == EOpFunction && candidate->getName() == name) {
                destinations.push_back(candidate);
                break;
            }
        }
    }